

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O3

SUNErrCode SUNQRAdd_CGS2(N_Vector *Q,sunrealtype *R,N_Vector df,int m,int mMax,void *QRdata)

{
  sunrealtype *dotprods;
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  sunrealtype __x;
  double dVar4;
  
  N_VScale(1.0,df,*QRdata);
  if (0 < m) {
    dotprods = R + mMax * m;
    N_VDotProdMulti(m,*QRdata,Q,dotprods);
    N_VLinearCombination(m,dotprods,Q,*(N_Vector *)((long)QRdata + 8));
    N_VLinearSum(1.0,*QRdata,-1.0,*(N_Vector *)((long)QRdata + 8),*(N_Vector *)((long)QRdata + 8));
    N_VDotProdMulti(m,*(N_Vector *)((long)QRdata + 8),Q,*(sunrealtype **)((long)QRdata + 0x10));
    uVar3 = (ulong)(uint)m;
    N_VLinearCombination(m,*(sunrealtype **)((long)QRdata + 0x10),Q,Q[uVar3]);
    N_VLinearSum(1.0,*(N_Vector *)((long)QRdata + 8),-1.0,Q[uVar3],*QRdata);
    lVar1 = *(long *)((long)QRdata + 0x10);
    uVar2 = 0;
    do {
      dotprods[uVar2] = dotprods[uVar2] + *(double *)(lVar1 + uVar2 * 8);
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  __x = N_VDotProd(*QRdata,*QRdata);
  dVar4 = 0.0;
  if (0.0 < __x) {
    if (__x < 0.0) {
      dVar4 = sqrt(__x);
    }
    else {
      dVar4 = SQRT(__x);
    }
  }
  R[(mMax + 1) * m] = dVar4;
  N_VScale(1.0 / dVar4,*QRdata,Q[m]);
  return 0;
}

Assistant:

SUNErrCode SUNQRAdd_CGS2(N_Vector* Q, sunrealtype* R, N_Vector df, int m,
                         int mMax, void* QRdata)
{
  SUNFunctionBegin(Q[0]->sunctx);
  sunindextype j;
  SUNQRData qrdata = (SUNQRData)QRdata;

  N_VScale(ONE, df, qrdata->vtemp);
  SUNCheckLastErr(); /* temp = df */

  if (m > 0)
  {
    /* s_k = Q_k-1^T df_aa -- update with sdata as a sunrealtype* array */
    SUNCheckCall(N_VDotProdMulti(m, qrdata->vtemp, Q, R + m * mMax));

    /* y = df - Q_k-1 s_k */
    SUNCheckCall(N_VLinearCombination(m, R + m * mMax, Q, qrdata->vtemp2));
    N_VLinearSum(ONE, qrdata->vtemp, -ONE, qrdata->vtemp2, qrdata->vtemp2);
    SUNCheckLastErr();

    /* z_k = Q_k-1^T y */
    SUNCheckCall(N_VDotProdMulti(m, qrdata->vtemp2, Q, qrdata->temp_array));

    /* df = y - Q_k-1 z_k */
    SUNCheckCall(N_VLinearCombination(m, qrdata->temp_array, Q, Q[m]));
    N_VLinearSum(ONE, qrdata->vtemp2, -ONE, Q[m], qrdata->vtemp);
    SUNCheckLastErr();

    /* R(1:k-1,k) = s_k + z_k */
    for (j = 0; j < m; j++)
    {
      R[m * mMax + j] = R[m * mMax + j] + qrdata->temp_array[j];
    }
  }

  /* R(k,k) = \| df \| */
  R[m * mMax + m] = N_VDotProd(qrdata->vtemp, qrdata->vtemp);
  SUNCheckLastErr();
  R[m * mMax + m] = SUNRsqrt(R[m * mMax + m]);
  /* Q(:,k) = df / R(k,k) */
  N_VScale((1 / R[m * mMax + m]), qrdata->vtemp, Q[m]);
  SUNCheckLastErr();

  return SUN_SUCCESS;
}